

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Class.cpp
# Opt level: O0

int __thiscall Class::getVariableOffset(Class *this)

{
  size_type sVar1;
  const_reference pvVar2;
  int local_20;
  int local_1c;
  int i;
  int toReturn;
  Class *this_local;
  
  sVar1 = std::vector<int,_std::allocator<int>_>::size(&this->sizes);
  if (sVar1 == 1) {
    this_local._4_4_ = 0;
  }
  else {
    local_1c = 0;
    local_20 = 0;
    while( true ) {
      sVar1 = std::vector<int,_std::allocator<int>_>::size(&this->sizes);
      if (sVar1 - 1 <= (ulong)(long)local_20) break;
      pvVar2 = std::vector<int,_std::allocator<int>_>::at(&this->sizes,(long)local_20);
      local_1c = *pvVar2 + local_1c;
      local_20 = local_20 + 1;
    }
    this_local._4_4_ = local_1c;
  }
  return this_local._4_4_;
}

Assistant:

int Class::getVariableOffset() const {
    if (sizes.size() == 1) return 0;
    int toReturn = 0;
    for (int i = 0; i < sizes.size() - 1; i++) toReturn += sizes.at(i);
    return toReturn;
}